

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timebase_helper.c
# Opt level: O1

target_ulong helper_load_dcr_ppc64(CPUPPCState_conflict2 *env,target_ulong dcrn)

{
  TCGContext_conflict10 *s;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TCGTemp *pTVar3;
  long lVar4;
  uint32_t val_00;
  ulong uVar5;
  long lVar6;
  TCGv_i32 *ppTVar7;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  uint32_t val;
  uint32_t local_c;
  
  iVar2 = (int)dcrn;
  local_c = 0;
  if (env->dcr_env == (ppc_dcr_t *)0x0) {
    helper_load_dcr_ppc64_cold_2();
  }
  else {
    iVar1 = ppc_dcr_read_ppc64(env->dcr_env,iVar2,&local_c);
    if (iVar1 == 0) {
      return (ulong)local_c;
    }
  }
  helper_load_dcr_ppc64_cold_1();
  if (env->dcr_env == (ppc_dcr_t *)0x0) {
    helper_store_dcr_ppc64_cold_2();
  }
  else {
    iVar2 = ppc_dcr_write_ppc64(env->dcr_env,iVar2,val_00);
    if (iVar2 == 0) {
      return CONCAT44(extraout_var,iVar2);
    }
  }
  helper_store_dcr_ppc64_cold_1();
  s = (TCGContext_conflict10 *)env->slb[1].sps;
  pcVar9 = cpu_reg_names;
  sVar10 = 0x134;
  ppTVar7 = cpu_crf;
  lVar6 = 0x210;
  uVar5 = 0;
  do {
    snprintf(pcVar9,sVar10,"crf%d",uVar5 & 0xffffffff);
    pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I32,s->cpu_env,lVar6,pcVar9);
    *ppTVar7 = (TCGv_i32)((long)pTVar3 - (long)s);
    pcVar9 = pcVar9 + 5;
    sVar10 = sVar10 - 5;
    uVar5 = uVar5 + 1;
    ppTVar7 = ppTVar7 + 1;
    lVar6 = lVar6 + 4;
  } while (uVar5 != 8);
  sVar10 = 0x10c;
  lVar6 = 0;
  uVar5 = 0;
  do {
    snprintf(pcVar9,sVar10,"r%d",uVar5 & 0xffffffff);
    pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,lVar6,pcVar9);
    *(long *)((long)cpu_gpr + lVar6) = (long)pTVar3 - (long)s;
    lVar4 = 4 - (ulong)(uVar5 < 10);
    pcVar9 = pcVar9 + lVar4;
    sVar10 = sVar10 - lVar4;
    snprintf(pcVar9,sVar10,"r%dH",uVar5 & 0xffffffff);
    pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,lVar6 + 0x100,pcVar9);
    *(long *)((long)cpu_gprh + lVar6) = (long)pTVar3 - (long)s;
    uVar8 = (ulong)(uVar5 < 10) ^ 5;
    pcVar9 = pcVar9 + uVar8;
    sVar10 = sVar10 - uVar8;
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 8;
  } while (uVar5 != 0x20);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x2a8,"nip");
  cpu_nip = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x280,"msr");
  cpu_msr = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x208,"ctr");
  cpu_ctr = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x200,"lr");
  cpu_lr = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x230,"cfar");
  cpu_cfar = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x238,"xer");
  cpu_xer = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x240,"SO");
  cpu_so = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x248,"OV");
  cpu_ov = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x250,"CA");
  cpu_ca = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,600,"OV32");
  cpu_ov32 = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x260,"CA32");
  cpu_ca32 = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x268,"reserve_addr");
  cpu_reserve = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x270,"reserve_val");
  cpu_reserve_val = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I64,s->cpu_env,0x12f50,"fpscr");
  cpu_fpscr = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_global_mem_new_internal_ppc64(s,TCG_TYPE_I32,s->cpu_env,0x2b8,"access_type");
  cpu_access_type = (TCGv_i32)((long)pTVar3 - (long)s);
  return (target_ulong)((long)pTVar3 - (long)s);
}

Assistant:

target_ulong helper_load_dcr(CPUPPCState *env, target_ulong dcrn)
{
    uint32_t val = 0;

    if (unlikely(env->dcr_env == NULL)) {
        qemu_log_mask(LOG_GUEST_ERROR, "No DCR environment\n");
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL |
                               POWERPC_EXCP_INVAL_INVAL, GETPC());
    } else {
        int ret;

        ret = ppc_dcr_read(env->dcr_env, (uint32_t)dcrn, &val);
        if (unlikely(ret != 0)) {
#if 0
            qemu_log_mask(LOG_GUEST_ERROR, "DCR read error %d %03x\n",
                          (uint32_t)dcrn, (uint32_t)dcrn);
#endif
            raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                                   POWERPC_EXCP_INVAL |
                                   POWERPC_EXCP_PRIV_REG, GETPC());
        }
    }
    return val;
}